

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O2

int mriStep_CheckCoupling(ARKodeMem ark_mem)

{
  uint uVar1;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  sunrealtype ***pppsVar6;
  sunrealtype ***pppsVar7;
  int iVar8;
  MRIStepCoupling MRIC;
  ulong uVar9;
  ulong uVar10;
  char *msgfmt;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  double dVar15;
  
  pvVar2 = ark_mem->step_mem;
  if (pvVar2 == (void *)0x0) {
    msgfmt = "Time step module memory is NULL.";
    iVar4 = -0x15;
    iVar8 = 0x72d;
    goto LAB_00142680;
  }
  MRIC = *(MRIStepCoupling *)((long)pvVar2 + 0x38);
  uVar1 = MRIC->stages;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    msgfmt = "stages < 1!";
    iVar4 = -0x29;
    iVar8 = 0x736;
    goto LAB_00142680;
  }
  if (MRIC->q < 1) {
    msgfmt = "method order < 1";
    iVar4 = -0x29;
    iVar8 = 0x73e;
    goto LAB_00142680;
  }
  if ((MRIC->p < 1) && (ark_mem->fixedstep == 0)) {
    msgfmt = "embedding order < 1";
    iVar4 = -0x29;
    iVar8 = 0x746;
    goto LAB_00142680;
  }
  if (*(int *)((long)pvVar2 + 0x1c) == 0) {
    if (*(int *)((long)pvVar2 + 0x18) == 0) goto LAB_0014235f;
    pppsVar7 = MRIC->W;
    if ((pppsVar7 == (sunrealtype ***)0x0) || (MRIC->G != (sunrealtype ***)0x0)) {
      msgfmt = "Invalid coupling table for an explicit problem!";
      iVar4 = -0x16;
      iVar8 = 0x75b;
      goto LAB_00142680;
    }
    pppsVar6 = (sunrealtype ***)0x0;
LAB_001423c5:
    uVar9 = 0;
    uVar10 = (ulong)(uint)MRIC->nmat;
    if (MRIC->nmat < 1) {
      uVar10 = uVar9;
    }
    dVar15 = 0.0;
    for (; uVar9 != uVar10; uVar9 = uVar9 + 1) {
      for (uVar11 = 0; uVar12 = uVar11, uVar11 != uVar5; uVar11 = uVar11 + 1) {
        for (; uVar5 != uVar12; uVar12 = uVar12 + 1) {
          dVar15 = dVar15 + ABS(pppsVar7[uVar9][uVar11][uVar12]);
        }
      }
    }
    if (2.220446049250313e-14 < dVar15) {
      msgfmt = "Coupling can be up to ERK (at most)!";
      iVar4 = -0x29;
      iVar8 = 0x77b;
      goto LAB_00142680;
    }
    if (pppsVar6 != (sunrealtype ***)0x0) goto LAB_00142450;
  }
  else {
    if (*(int *)((long)pvVar2 + 0x18) != 0) {
      pppsVar7 = MRIC->W;
      if ((pppsVar7 == (sunrealtype ***)0x0) ||
         (pppsVar6 = MRIC->G, pppsVar6 == (sunrealtype ***)0x0)) {
        msgfmt = "Invalid coupling table for an IMEX problem!";
        iVar4 = -0x16;
        iVar8 = 0x751;
        goto LAB_00142680;
      }
      goto LAB_001423c5;
    }
LAB_0014235f:
    if ((MRIC->W != (sunrealtype ***)0x0) || (pppsVar6 = MRIC->G, pppsVar6 == (sunrealtype ***)0x0))
    {
      msgfmt = "Invalid coupling table fro an implicit problem!";
      iVar4 = -0x16;
      iVar8 = 0x765;
      goto LAB_00142680;
    }
LAB_00142450:
    uVar9 = 0;
    uVar10 = (ulong)(uint)MRIC->nmat;
    if (MRIC->nmat < 1) {
      uVar10 = uVar9;
    }
    dVar15 = 0.0;
    for (; uVar9 != uVar10; uVar9 = uVar9 + 1) {
      lVar13 = 1;
      for (uVar11 = 0; lVar14 = lVar13, uVar11 != uVar5; uVar11 = uVar11 + 1) {
        for (; (int)lVar14 < (int)uVar1; lVar14 = lVar14 + 1) {
          dVar15 = dVar15 + ABS(pppsVar6[uVar9][uVar11][lVar14]);
        }
        lVar13 = lVar13 + 1;
      }
    }
    if (2.220446049250313e-14 < dVar15) {
      msgfmt = "Coupling can be up to DIRK (at most)!";
      iVar4 = -0x29;
      iVar8 = 0x791;
      goto LAB_00142680;
    }
  }
  lVar13 = 1;
  bVar3 = true;
  for (iVar8 = 0; iVar4 = (int)uVar5, iVar8 < iVar4; iVar8 = iVar8 + 1) {
    iVar4 = mriStepCoupling_GetStageType(MRIC,iVar8);
    if (iVar4 == 3) {
      bVar3 = false;
    }
    MRIC = *(MRIStepCoupling *)((long)pvVar2 + 0x38);
    uVar5 = (ulong)(uint)MRIC->stages;
  }
  if (bVar3) {
    bVar3 = true;
    for (; lVar13 < iVar4; lVar13 = lVar13 + 1) {
      if (MRIC->c[lVar13] - MRIC->c[lVar13 + -1] < -2.220446049250313e-14) {
        bVar3 = false;
      }
    }
    if (bVar3) {
      dVar15 = ABS(*MRIC->c);
      uVar10 = 0;
      if (iVar4 < 1) {
        uVar5 = 0;
      }
      uVar9 = (ulong)(uint)MRIC->nmat;
      if (MRIC->nmat < 1) {
        uVar9 = uVar10;
      }
      for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
        for (uVar11 = 0; uVar5 != uVar11; uVar11 = uVar11 + 1) {
          if (MRIC->W != (sunrealtype ***)0x0) {
            dVar15 = dVar15 + ABS((*MRIC->W[uVar10])[uVar11]);
          }
          if (MRIC->G != (sunrealtype ***)0x0) {
            dVar15 = dVar15 + ABS((*MRIC->G[uVar10])[uVar11]);
          }
        }
      }
      if (dVar15 <= 2.220446049250313e-14) {
        if (ABS(1.0 - MRIC->c[(long)iVar4 + -1]) <= 2.220446049250313e-14) {
          return 0;
        }
        msgfmt = "Final stage time must be equal 1.";
        iVar4 = -0x29;
        iVar8 = 0x7cb;
      }
      else {
        msgfmt = "First stage must equal old solution.";
        iVar4 = -0x29;
        iVar8 = 0x7c3;
      }
    }
    else {
      msgfmt = "Stage times must be sorted.";
      iVar4 = -0x29;
      iVar8 = 0x7b2;
    }
  }
  else {
    msgfmt = "solve-coupled DIRK stages not currently supported";
    iVar4 = -0x29;
    iVar8 = 0x7a2;
  }
LAB_00142680:
  arkProcessError(ark_mem,iVar4,iVar8,"mriStep_CheckCoupling",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep.c"
                  ,msgfmt);
  return iVar4;
}

Assistant:

int mriStep_CheckCoupling(ARKodeMem ark_mem)
{
  int i, j, k;
  sunbooleantype okay;
  ARKodeMRIStepMem step_mem;
  sunrealtype Gabs, Wabs;
  const sunrealtype tol = SUN_RCONST(100.0) * SUN_UNIT_ROUNDOFF;

  /* access ARKodeMRIStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_MRISTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeMRIStepMem)ark_mem->step_mem;

  /* check that stages > 0 */
  if (step_mem->MRIC->stages < 1)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "stages < 1!");
    return (ARK_INVALID_TABLE);
  }

  /* check that method order q > 0 */
  if (step_mem->MRIC->q < 1)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "method order < 1");
    return (ARK_INVALID_TABLE);
  }

  /* check that embedding order p > 0 (if adaptive) */
  if ((step_mem->MRIC->p < 1) && (!ark_mem->fixedstep))
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "embedding order < 1");
    return (ARK_INVALID_TABLE);
  }

  /* Check that the matrices are defined appropriately */
  if (step_mem->implicit_rhs && step_mem->explicit_rhs)
  {
    /* ImEx */
    if (!(step_mem->MRIC->W) || !(step_mem->MRIC->G))
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Invalid coupling table for an IMEX problem!");
      return (ARK_ILL_INPUT);
    }
  }
  else if (step_mem->explicit_rhs)
  {
    /* Explicit */
    if (!(step_mem->MRIC->W) || step_mem->MRIC->G)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Invalid coupling table for an explicit problem!");
      return (ARK_ILL_INPUT);
    }
  }
  else
  {
    /* Implicit */
    if (step_mem->MRIC->W || !(step_mem->MRIC->G))
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Invalid coupling table fro an implicit problem!");
      return (ARK_ILL_INPUT);
    }
  }

  /* Check that W tables are strictly lower triangular */
  if (step_mem->MRIC->W)
  {
    Wabs = SUN_RCONST(0.0);
    for (k = 0; k < step_mem->MRIC->nmat; k++)
    {
      for (i = 0; i < step_mem->MRIC->stages; i++)
      {
        for (j = i; j < step_mem->MRIC->stages; j++)
        {
          Wabs += SUNRabs(step_mem->MRIC->W[k][i][j]);
        }
      }
    }
    if (Wabs > tol)
    {
      arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                      "Coupling can be up to ERK (at most)!");
      return (ARK_INVALID_TABLE);
    }
  }

  /* Check that G tables are lower triangular */
  if (step_mem->MRIC->G)
  {
    Gabs = SUN_RCONST(0.0);
    for (k = 0; k < step_mem->MRIC->nmat; k++)
    {
      for (i = 0; i < step_mem->MRIC->stages; i++)
      {
        for (j = i + 1; j < step_mem->MRIC->stages; j++)
        {
          Gabs += SUNRabs(step_mem->MRIC->G[k][i][j]);
        }
      }
    }
    if (Gabs > tol)
    {
      arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                      "Coupling can be up to DIRK (at most)!");
      return (ARK_INVALID_TABLE);
    }
  }

  /* Check that no stage has MRISTAGE_DIRK_FAST type (for now) */
  okay = SUNTRUE;
  for (i = 0; i < step_mem->MRIC->stages; i++)
  {
    if (mriStepCoupling_GetStageType(step_mem->MRIC, i) == MRISTAGE_DIRK_FAST)
    {
      okay = SUNFALSE;
    }
  }
  if (!okay)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "solve-coupled DIRK stages not currently supported");
    return (ARK_INVALID_TABLE);
  }

  /* check that stage times are sorted */
  okay = SUNTRUE;
  for (i = 1; i < step_mem->MRIC->stages; i++)
  {
    if ((step_mem->MRIC->c[i] - step_mem->MRIC->c[i - 1]) < -tol)
    {
      okay = SUNFALSE;
    }
  }
  if (!okay)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "Stage times must be sorted.");
    return (ARK_INVALID_TABLE);
  }

  /* check that the first stage is just the old step solution */
  Gabs = SUNRabs(step_mem->MRIC->c[0]);
  for (k = 0; k < step_mem->MRIC->nmat; k++)
  {
    for (j = 0; j < step_mem->MRIC->stages; j++)
    {
      if (step_mem->MRIC->W) { Gabs += SUNRabs(step_mem->MRIC->W[k][0][j]); }
      if (step_mem->MRIC->G) { Gabs += SUNRabs(step_mem->MRIC->G[k][0][j]); }
    }
  }
  if (Gabs > tol)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "First stage must equal old solution.");
    return (ARK_INVALID_TABLE);
  }

  /* check that the last stage is at the final time */
  if (SUNRabs(ONE - step_mem->MRIC->c[step_mem->MRIC->stages - 1]) > tol)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "Final stage time must be equal 1.");
    return (ARK_INVALID_TABLE);
  }

  return (ARK_SUCCESS);
}